

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O3

void __thiscall
cmDocumentation::SetSection(cmDocumentation *this,char *name,cmDocumentationSection *section)

{
  pointer pcVar1;
  cmDocumentationSection *this_00;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> local_28;
  
  this_00 = SectionAtName(this,name);
  std::__cxx11::string::operator=((string *)this_00,(string *)section);
  local_28.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this_00->Entries).
       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  pcVar1 = (section->Entries).
           super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_28.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this_00->Entries).
       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this_00->Entries).
       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this_00->Entries).super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (section->Entries).
       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this_00->Entries).super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = pcVar1;
  (this_00->Entries).super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (section->Entries).
       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (section->Entries).super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (section->Entries).super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (section->Entries).super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&local_28);
  return;
}

Assistant:

void cmDocumentation::SetSection(const char* name,
                                 cmDocumentationSection section)
{
  this->SectionAtName(name) = std::move(section);
}